

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O3

vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *
mercatortile::children
          (vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *__return_storage_ptr__,
          Tile *tile)

{
  pointer *ppTVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  iterator iVar6;
  Tile local_20;
  
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = tile->x;
  uVar4 = tile->y;
  local_20.y = uVar4 * 2;
  local_20.x = uVar2 * 2;
  local_20.z = tile->z + 1;
  std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
  _M_realloc_insert<mercatortile::Tile>(__return_storage_ptr__,(iterator)0x0,&local_20);
  iVar6._M_current =
       (__return_storage_ptr__->
       super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_20.z = tile->z + 1;
  local_20.y = tile->y * 2;
  local_20.x = tile->x * 2 + 1;
  if (iVar6._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
    _M_realloc_insert<mercatortile::Tile>(__return_storage_ptr__,iVar6,&local_20);
    iVar6._M_current =
         (__return_storage_ptr__->
         super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar6._M_current)->z = local_20.z;
    (iVar6._M_current)->x = local_20.x;
    (iVar6._M_current)->y = local_20.y;
    iVar6._M_current =
         (__return_storage_ptr__->
         super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (__return_storage_ptr__->
    super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current;
  }
  local_20.x = tile->x * 2;
  local_20.y = tile->y * 2 + 1;
  local_20.z = tile->z + 1;
  if (iVar6._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
    _M_realloc_insert<mercatortile::Tile>(__return_storage_ptr__,iVar6,&local_20);
    iVar6._M_current =
         (__return_storage_ptr__->
         super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar6._M_current)->z = local_20.z;
    (iVar6._M_current)->x = local_20.x;
    (iVar6._M_current)->y = local_20.y;
    iVar6._M_current =
         (__return_storage_ptr__->
         super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (__return_storage_ptr__->
    super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current;
  }
  uVar3 = tile->x;
  uVar5 = tile->y;
  local_20._0_8_ = CONCAT44(uVar5 * 2,uVar3 * 2) | (ulong)DAT_00104090;
  local_20.z = tile->z + 1;
  if (iVar6._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
    _M_realloc_insert<mercatortile::Tile>(__return_storage_ptr__,iVar6,&local_20);
  }
  else {
    (iVar6._M_current)->z = local_20.z;
    (iVar6._M_current)->x = (int)local_20._0_8_;
    (iVar6._M_current)->y = (int)((ulong)local_20._0_8_ >> 0x20);
    ppTVar1 = &(__return_storage_ptr__->
               super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Tile> children(const Tile &tile)
{
    vector<Tile> return_tiles;
    return_tiles.push_back(Tile{tile.x * 2, tile.y * 2, tile.z + 1});
    return_tiles.push_back(Tile{tile.x * 2 + 1, tile.y * 2, tile.z + 1});
    return_tiles.push_back(Tile{tile.x * 2, tile.y * 2 + 1, tile.z + 1});
    return_tiles.push_back(Tile{tile.x * 2 + 1, tile.y * 2 + 1, tile.z + 1});

    return return_tiles;
}